

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O3

int32_t __thiscall
icu_63::UnicodeSetStringSpan::spanBack
          (UnicodeSetStringSpan *this,UChar *s,int32_t length,USetSpanCondition spanCondition)

{
  UnicodeSet *this_00;
  UChar *pUVar1;
  byte bVar2;
  ushort uVar3;
  UChar UVar4;
  uint uVar5;
  uint uVar6;
  char cVar7;
  uint length_00;
  uint uVar8;
  int iVar9;
  int iVar10;
  int32_t iVar11;
  uint uVar12;
  UBool *pUVar13;
  void *pvVar14;
  ushort *puVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  UChar *pUVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  bool bVar28;
  int32_t oldPos;
  OffsetList offsets;
  uint local_cc;
  OffsetList local_78;
  long local_50;
  UnicodeSetStringSpan *local_48;
  uint8_t *local_40;
  long local_38;
  
  if (spanCondition == USET_SPAN_NOT_CONTAINED) {
    iVar11 = spanNotBack(this,s,length);
    return iVar11;
  }
  this_00 = &this->spanSet;
  length_00 = UnicodeSet::spanBack(this_00,s,length,USET_SPAN_CONTAINED);
  if (length_00 == 0) {
    uVar16 = 0;
  }
  else {
    local_78.list = local_78.staticList;
    local_78.capacity = 0;
    local_78.length = 0;
    local_78.start = 0;
    if (spanCondition == USET_SPAN_CONTAINED) {
      iVar18 = this->maxLength16;
      if ((long)iVar18 < 0x11) {
        local_78.capacity = 0x10;
        local_78.length = 0;
        iVar18 = 0x10;
      }
      else {
        pUVar13 = (UBool *)uprv_malloc_63((long)iVar18);
        if (pUVar13 == (UBool *)0x0) {
          iVar18 = local_78.capacity;
        }
        else {
          local_78.capacity = iVar18;
          local_78.list = pUVar13;
        }
      }
      memset(local_78.list,0,(long)iVar18);
    }
    local_cc = length - length_00;
    uVar5 = this->strings->count;
    lVar20 = 0;
    if (this->all != '\0') {
      lVar20 = (long)(int)uVar5;
    }
    local_40 = this->spanLengths + lVar20;
    local_50 = (long)length;
    local_48 = this;
LAB_002e18c5:
    do {
      if (spanCondition == USET_SPAN_CONTAINED) {
        if (0 < (int)uVar5) {
          local_38 = (long)(int)local_cc;
          uVar24 = 0;
          do {
            bVar2 = local_40[uVar24];
            uVar16 = (uint)bVar2;
            if (bVar2 != 0xff) {
              pvVar14 = UVector::elementAt(local_48->strings,(int32_t)uVar24);
              uVar3 = *(ushort *)((long)pvVar14 + 8);
              if ((uVar3 & 0x11) == 0) {
                if ((uVar3 & 2) == 0) {
                  puVar15 = *(ushort **)((long)pvVar14 + 0x18);
                }
                else {
                  puVar15 = (ushort *)((long)pvVar14 + 10);
                }
              }
              else {
                puVar15 = (ushort *)0x0;
              }
              if ((short)uVar3 < 0) {
                iVar18 = *(int *)((long)pvVar14 + 0xc);
              }
              else {
                iVar18 = (int)(short)uVar3 >> 5;
              }
              if (bVar2 == 0xfe) {
                uVar16 = 0xffffffff;
                if ((iVar18 != 1) && ((*puVar15 & 0xfc00) == 0xd800)) {
                  uVar16 = ~(uint)((puVar15[1] & 0xfc00) == 0xdc00);
                }
                uVar16 = uVar16 + iVar18;
              }
              uVar12 = local_cc;
              if ((int)uVar16 < (int)local_cc) {
                uVar12 = uVar16;
              }
              if ((int)(iVar18 - uVar12) <= (int)length_00) {
                lVar23 = (long)iVar18;
                lVar20 = (long)(int)(iVar18 - uVar12);
                iVar21 = length_00 + 1 + uVar12;
                uVar8 = local_cc;
                if ((int)uVar16 < (int)local_cc) {
                  uVar8 = uVar16;
                }
                lVar17 = (long)(int)uVar16;
                if (local_38 <= (int)uVar16) {
                  lVar17 = local_38;
                }
                pUVar22 = s + (long)(int)length_00 + (lVar17 - lVar23);
                do {
                  iVar9 = local_78.start + (uint)lVar20;
                  iVar11 = local_78.capacity;
                  if (iVar9 < local_78.capacity) {
                    iVar11 = 0;
                  }
                  iVar9 = iVar9 - iVar11;
                  if (local_78.list[iVar9] == '\0') {
                    lVar26 = (int)length_00 - lVar20;
                    pUVar1 = s + lVar26;
                    lVar17 = 0;
                    iVar10 = iVar18 + 1;
                    do {
                      if (*(short *)((long)pUVar22 + lVar17) != *(short *)((long)puVar15 + lVar17))
                      goto LAB_002e1a42;
                      lVar17 = lVar17 + 2;
                      iVar10 = iVar10 + -1;
                    } while (1 < iVar10);
                    if ((((lVar26 < 1) || ((pUVar1[-1] & 0xfc00U) != 0xd800)) ||
                        ((*pUVar1 & 0xfc00U) != 0xdc00)) &&
                       (((local_50 - lVar23 <= lVar26 || ((pUVar1[lVar23 + -1] & 0xfc00U) != 0xd800)
                         ) || ((pUVar1[lVar23] & 0xfc00U) != 0xdc00)))) {
                      if (length_00 == (uint)lVar20) goto LAB_002e1e26;
                      local_78.list[iVar9] = '\x01';
                      local_78.length = local_78.length + 1;
                    }
                  }
LAB_002e1a42:
                  bVar28 = uVar12 == 0;
                  uVar12 = uVar12 - 1;
                  if (bVar28) break;
                  lVar20 = lVar20 + 1;
                  pUVar22 = pUVar22 + -1;
                } while (iVar21 - uVar8 != (int)lVar20);
              }
            }
            uVar24 = uVar24 + 1;
          } while (uVar24 != uVar5);
        }
LAB_002e1cc0:
        if (length_00 == length || local_cc != 0) {
          uVar16 = length_00;
          if (local_78.length == 0) break;
        }
        else {
          if (local_78.length == 0) {
            uVar16 = UnicodeSet::spanBack(this_00,s,length_00,USET_SPAN_CONTAINED);
            if (uVar16 != 0) {
              uVar12 = length_00 - uVar16;
              length_00 = uVar16;
              local_cc = uVar12;
              goto LAB_002e1e19;
            }
            break;
          }
          UVar4 = s[(long)(int)length_00 + -1];
          if ((((int)length_00 < 2) || (((ushort)UVar4 & 0xfc00) != 0xdc00)) ||
             ((s[(ulong)length_00 - 2] & 0xfc00U) != 0xd800)) {
            cVar7 = UnicodeSet::contains(this_00,(uint)(ushort)UVar4);
            iVar18 = 1;
          }
          else {
            cVar7 = UnicodeSet::contains
                              (this_00,(uint)(ushort)UVar4 +
                                       (uint)(ushort)s[(ulong)length_00 - 2] * 0x400 + -0x35fdc00);
            iVar18 = 2;
          }
          if (cVar7 != '\0') {
            length_00 = length_00 - iVar18;
            if (length_00 == 0) {
LAB_002e1e26:
              uVar16 = 0;
              break;
            }
            iVar11 = local_78.capacity;
            if (iVar18 + local_78.start < local_78.capacity) {
              iVar11 = 0;
            }
            local_78.start = (iVar18 + local_78.start) - iVar11;
            if (local_78.list[local_78.start] != '\0') {
              local_78.list[local_78.start] = '\0';
              local_78.length = local_78.length + -1;
            }
            local_cc = 0;
            goto LAB_002e18c5;
          }
        }
        iVar11 = OffsetList::popMinimum(&local_78);
        length_00 = length_00 - iVar11;
        local_cc = 0;
        goto LAB_002e18c5;
      }
      if ((int)uVar5 < 1) {
        iVar18 = 0;
        bVar28 = false;
      }
      else {
        lVar20 = (long)(int)length_00;
        uVar24 = 0;
        uVar16 = 0;
        uVar25 = 0;
        do {
          bVar2 = local_40[uVar24];
          pvVar14 = UVector::elementAt(local_48->strings,(int32_t)uVar24);
          uVar3 = *(ushort *)((long)pvVar14 + 8);
          if ((uVar3 & 0x11) == 0) {
            if ((uVar3 & 2) == 0) {
              lVar23 = *(long *)((long)pvVar14 + 0x18);
            }
            else {
              lVar23 = (long)pvVar14 + 10;
            }
          }
          else {
            lVar23 = 0;
          }
          if ((short)uVar3 < 0) {
            uVar12 = *(uint *)((long)pvVar14 + 0xc);
          }
          else {
            uVar12 = (int)(short)uVar3 >> 5;
          }
          uVar8 = (uint)bVar2;
          if (0xfd < bVar2) {
            uVar8 = uVar12;
          }
          uVar6 = local_cc;
          if ((int)uVar8 < (int)local_cc) {
            uVar6 = uVar8;
          }
          if (((int)(uVar12 - uVar6) <= (int)length_00) && ((int)uVar16 <= (int)uVar6)) {
            lVar26 = (long)(int)uVar12;
            uVar19 = (ulong)(int)(uVar12 - uVar6);
            lVar17 = (long)(int)uVar8;
            if ((long)(int)local_cc <= (long)(int)uVar8) {
              lVar17 = (long)(int)local_cc;
            }
            pUVar22 = s + lVar20 + (lVar17 - lVar26);
            do {
              if (((int)uVar16 < (int)uVar6) || ((long)(int)uVar25 < (long)uVar19)) {
                lVar27 = lVar20 - uVar19;
                pUVar1 = s + lVar27;
                lVar17 = 0;
                iVar18 = uVar12 + 1;
                do {
                  if (*(short *)((long)pUVar22 + lVar17) != *(short *)(lVar23 + lVar17))
                  goto LAB_002e1c6d;
                  lVar17 = lVar17 + 2;
                  iVar18 = iVar18 + -1;
                } while (1 < iVar18);
                if ((((lVar27 < 1) || ((pUVar1[-1] & 0xfc00U) != 0xd800)) ||
                    ((*pUVar1 & 0xfc00U) != 0xdc00)) &&
                   (((local_50 - lVar26 <= lVar27 || ((pUVar1[lVar26 + -1] & 0xfc00U) != 0xd800)) ||
                    ((pUVar1[lVar26] & 0xfc00U) != 0xdc00)))) {
                  uVar25 = uVar19 & 0xffffffff;
                  uVar16 = uVar6;
                  break;
                }
              }
LAB_002e1c6d:
              if (lVar20 <= (long)uVar19) break;
              uVar19 = uVar19 + 1;
              pUVar22 = pUVar22 + -1;
              bVar28 = (int)uVar16 < (int)uVar6;
              uVar6 = uVar6 - 1;
            } while (bVar28);
          }
          iVar18 = (int)uVar25;
          uVar24 = uVar24 + 1;
        } while (uVar24 != uVar5);
        bVar28 = uVar16 != 0;
      }
      if ((iVar18 == 0) && (!bVar28)) goto LAB_002e1cc0;
      local_cc = 0;
      uVar16 = 0;
      uVar12 = length_00 - iVar18;
      length_00 = uVar12;
LAB_002e1e19:
    } while (uVar12 != 0);
    OffsetList::~OffsetList(&local_78);
  }
  return uVar16;
}

Assistant:

int32_t UnicodeSetStringSpan::spanBack(const UChar *s, int32_t length, USetSpanCondition spanCondition) const {
    if(spanCondition==USET_SPAN_NOT_CONTAINED) {
        return spanNotBack(s, length);
    }
    int32_t pos=spanSet.spanBack(s, length, USET_SPAN_CONTAINED);
    if(pos==0) {
        return 0;
    }
    int32_t spanLength=length-pos;

    // Consider strings; they may overlap with the span.
    OffsetList offsets;
    if(spanCondition==USET_SPAN_CONTAINED) {
        // Use offset list to try all possibilities.
        offsets.setMaxLength(maxLength16);
    }
    int32_t i, stringsLength=strings.size();
    uint8_t *spanBackLengths=spanLengths;
    if(all) {
        spanBackLengths+=stringsLength;
    }
    for(;;) {
        if(spanCondition==USET_SPAN_CONTAINED) {
            for(i=0; i<stringsLength; ++i) {
                int32_t overlap=spanBackLengths[i];
                if(overlap==ALL_CP_CONTAINED) {
                    continue;  // Irrelevant string.
                }
                const UnicodeString &string=*(const UnicodeString *)strings.elementAt(i);
                const UChar *s16=string.getBuffer();
                int32_t length16=string.length();

                // Try to match this string at pos-(length16-overlap)..pos-length16.
                if(overlap>=LONG_SPAN) {
                    overlap=length16;
                    // While contained: No point matching fully inside the code point span.
                    int32_t len1=0;
                    U16_FWD_1(s16, len1, overlap);
                    overlap-=len1;  // Length of the string minus the first code point.
                }
                if(overlap>spanLength) {
                    overlap=spanLength;
                }
                int32_t dec=length16-overlap;  // Keep dec+overlap==length16.
                for(;;) {
                    if(dec>pos) {
                        break;
                    }
                    // Try to match if the decrement is not listed already.
                    if(!offsets.containsOffset(dec) && matches16CPB(s, pos-dec, length, s16, length16)) {
                        if(dec==pos) {
                            return 0;  // Reached the start of the string.
                        }
                        offsets.addOffset(dec);
                    }
                    if(overlap==0) {
                        break;
                    }
                    --overlap;
                    ++dec;
                }
            }
        } else /* USET_SPAN_SIMPLE */ {
            int32_t maxDec=0, maxOverlap=0;
            for(i=0; i<stringsLength; ++i) {
                int32_t overlap=spanBackLengths[i];
                // For longest match, we do need to try to match even an all-contained string
                // to find the match from the latest end.

                const UnicodeString &string=*(const UnicodeString *)strings.elementAt(i);
                const UChar *s16=string.getBuffer();
                int32_t length16=string.length();

                // Try to match this string at pos-(length16-overlap)..pos-length16.
                if(overlap>=LONG_SPAN) {
                    overlap=length16;
                    // Longest match: Need to match fully inside the code point span
                    // to find the match from the latest end.
                }
                if(overlap>spanLength) {
                    overlap=spanLength;
                }
                int32_t dec=length16-overlap;  // Keep dec+overlap==length16.
                for(;;) {
                    if(dec>pos || overlap<maxOverlap) {
                        break;
                    }
                    // Try to match if the string is longer or ends later.
                    if( (overlap>maxOverlap || /* redundant overlap==maxOverlap && */ dec>maxDec) &&
                        matches16CPB(s, pos-dec, length, s16, length16)
                    ) {
                        maxDec=dec;  // Longest match from latest end.
                        maxOverlap=overlap;
                        break;
                    }
                    --overlap;
                    ++dec;
                }
            }

            if(maxDec!=0 || maxOverlap!=0) {
                // Longest-match algorithm, and there was a string match.
                // Simply continue before it.
                pos-=maxDec;
                if(pos==0) {
                    return 0;  // Reached the start of the string.
                }
                spanLength=0;  // Match strings from before a string match.
                continue;
            }
        }
        // Finished trying to match all strings at pos.

        if(spanLength!=0 || pos==length) {
            // The position is before an unlimited code point span (spanLength!=0),
            // not before a string match.
            // The only position where spanLength==0 before a span is pos==length.
            // Otherwise, an unlimited code point span is only tried again when no
            // strings match, and if such a non-initial span fails we stop.
            if(offsets.isEmpty()) {
                return pos;  // No strings matched before a span.
            }
            // Match strings from before the next string match.
        } else {
            // The position is before a string match (or a single code point).
            if(offsets.isEmpty()) {
                // No more strings matched before a previous string match.
                // Try another code point span from before the last string match.
                int32_t oldPos=pos;
                pos=spanSet.spanBack(s, oldPos, USET_SPAN_CONTAINED);
                spanLength=oldPos-pos;
                if( pos==0 ||           // Reached the start of the string, or
                    spanLength==0       // neither strings nor span progressed.
                ) {
                    return pos;
                }
                continue;  // spanLength>0: Match strings from before a span.
            } else {
                // Try to match only one code point from before a string match if some
                // string matched beyond it, so that we try all possible positions
                // and don't overshoot.
                spanLength=spanOneBack(spanSet, s, pos);
                if(spanLength>0) {
                    if(spanLength==pos) {
                        return 0;  // Reached the start of the string.
                    }
                    // Match strings before this code point.
                    // There cannot be any decrements below it because UnicodeSet strings
                    // contain multiple code points.
                    pos-=spanLength;
                    offsets.shift(spanLength);
                    spanLength=0;
                    continue;  // Match strings from before a single code point.
                }
                // Match strings from before the next string match.
            }
        }
        pos-=offsets.popMinimum();
        spanLength=0;  // Match strings from before a string match.
    }
}